

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reversed_tests.cpp
# Opt level: O2

void __thiscall
omp_reversed_reference_case_increase_values_Test::TestBody
          (omp_reversed_reference_case_increase_values_Test *this)

{
  _List_iterator<int> __tmp;
  _List_node_base *this_00;
  char *in_R9;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  AssertHelper AStack_98;
  Message local_90;
  list<int,_std::allocator<int>_> expecting;
  list<int,_std::allocator<int>_> values;
  string local_58;
  AssertionResult gtest_ar_;
  reverse_iterator<std::_List_iterator<int>_> local_28;
  reverse_iterator<std::_List_iterator<int>_> local_20;
  
  local_58._M_dataplus._M_p = (pointer)0x400000001;
  local_58._M_string_length = 0x200000003;
  local_58.field_2._M_allocated_capacity._0_4_ = 5;
  this_00 = (_List_node_base *)&values;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_58;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)this_00,__l,(allocator_type *)&expecting);
  local_58._M_dataplus._M_p = (char *)0x300000006;
  local_58._M_string_length = 0x500000004;
  local_58.field_2._M_allocated_capacity._0_4_ = 2;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_58;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            (&expecting,__l_00,(allocator_type *)&gtest_ar_);
  while (this_00 !=
         values.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
         _M_next) {
    this_00 = this_00->_M_prev;
    *(int *)&this_00[1]._M_next = *(int *)&this_00[1]._M_next + 1;
  }
  local_20.current._M_node = (_List_iterator<int>)&values;
  local_28.current._M_node =
       (_List_iterator<int>)
       (_List_iterator<int>)
       values.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
       _M_next;
  gtest_ar_.success_ =
       std::equal<std::reverse_iterator<std::_List_iterator<int>>,std::_List_const_iterator<int>>
                 (&local_20,&local_28,
                  (_List_const_iterator<int>)
                  expecting.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                  super__List_node_base._M_next,(_List_node_base *)&expecting);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&gtest_ar_,
               (AssertionResult *)
               "std::equal(std::cbegin(reversed_values), std::cend(reversed_values), std::cbegin(expecting), std::cend(expecting))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/reversed_tests.cpp"
               ,0x44,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    std::__cxx11::string::~string((string *)&local_58);
    if (local_90.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_90.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            (&expecting.super__List_base<int,_std::allocator<int>_>);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            (&values.super__List_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(omp_reversed, reference_case_increase_values) {
  std::list values = {1, 4, 3, 2, 5};

  auto reversed_values = omp::reversed(values);

  std::list expecting = {6, 3, 4, 5, 2};

  for (auto &v : reversed_values)
    ++v;

  ASSERT_TRUE(std::equal(std::cbegin(reversed_values),
                         std::cend(reversed_values), std::cbegin(expecting),
                         std::cend(expecting)));
}